

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorGradient.cpp
# Opt level: O0

DecoratorDataHandle __thiscall
Rml::DecoratorRadialGradient::GenerateElementData
          (DecoratorRadialGradient *this,Element *element,BoxArea paint_area)

{
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>
  *this_00;
  code *pcVar1;
  Vector2f rhs;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>
  init;
  float b;
  bool bVar2;
  RenderManager *mesh_00;
  ComputedValues *this_01;
  Pool<Rml::ShaderElementData> *this_02;
  float fVar3;
  RadialGradientShape RVar4;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
  *local_3b8;
  undefined1 local_370 [24];
  ShaderElementData *element_data;
  Vector2<float> local_350;
  reference local_348;
  Vertex *vertex;
  iterator __end1;
  iterator __begin1;
  Vector<Vertex> *__range1;
  Vector2f render_offset;
  byte alpha;
  ComputedValues *computed;
  Mesh mesh;
  Variant local_2d8;
  Variant local_2b0;
  Variant local_288;
  Variant local_260;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
  *local_238;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
  local_230;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
  local_1e8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
  local_1a0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
  local_158;
  iterator local_110;
  size_type local_108;
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  local_100;
  allocator<char> local_d1;
  Dictionary local_d0;
  undefined1 local_b0 [8];
  CompiledShader shader;
  ColorStopList resolved_stops;
  float soft_spacing;
  Vector2f local_78;
  RadialGradientShape gradient_shape;
  Vector2f dimensions;
  RenderBox render_box;
  RenderManager *render_manager;
  BoxArea paint_area_local;
  Element *element_local;
  DecoratorRadialGradient *this_local;
  
  mesh_00 = Element::GetRenderManager(element);
  if (mesh_00 == (RenderManager *)0x0) {
    this_local = (DecoratorRadialGradient *)0x0;
  }
  else {
    bVar2 = ::std::vector<Rml::ColorStop,_std::allocator<Rml::ColorStop>_>::empty
                      (&this->color_stops);
    if (((bVar2) || ((this->shape != Circle && (this->shape != Ellipse)))) &&
       (bVar2 = Assert("RMLUI_ASSERT(!color_stops.empty() && (shape == Shape::Circle || shape == Shape::Ellipse))"
                       ,
                       "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DecoratorGradient.cpp"
                       ,0x1b6), !bVar2)) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    Element::GetRenderBox((RenderBox *)&dimensions,element,paint_area,0);
    gradient_shape.radius = RenderBox::GetFillSize((RenderBox *)&dimensions);
    RVar4 = CalculateRadialGradientShape(this,element,gradient_shape.radius);
    local_78 = RVar4.center;
    gradient_shape.center.x = RVar4.radius.x;
    fVar3 = gradient_shape.center.x;
    gradient_shape.center.y = RVar4.radius.y;
    b = gradient_shape.center.y;
    gradient_shape.center = RVar4.radius;
    fVar3 = Math::Min<float>(fVar3,b);
    ResolveColorStops((ColorStopList *)
                      &shader.super_UniqueRenderResource<Rml::CompiledShader,_unsigned_long,_0UL>.
                       resource_handle,element,gradient_shape.center.x,1.0 / fVar3,
                      &this->color_stops);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"radial-gradient",&local_d1);
    mesh.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._7_1_ = 1;
    local_238 = &local_230;
    Variant::Variant<Rml::Vector2<float>&,void>(&local_260,&local_78);
    ::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
    ::pair<const_char_(&)[7],_Rml::Variant,_true>(&local_230,(char (*) [7])"center",&local_260);
    local_238 = &local_1e8;
    Variant::Variant<Rml::Vector2<float>&,void>(&local_288,&gradient_shape.center);
    ::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
    ::pair<const_char_(&)[7],_Rml::Variant,_true>(&local_1e8,(char (*) [7])0x7168c4,&local_288);
    local_238 = &local_1a0;
    Variant::Variant<bool_const&,void>(&local_2b0,&this->repeating);
    ::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
    ::pair<const_char_(&)[10],_Rml::Variant,_true>(&local_1a0,(char (*) [10])"repeating",&local_2b0)
    ;
    local_238 = &local_158;
    Variant::Variant<std::vector<Rml::ColorStop,std::allocator<Rml::ColorStop>>,void>
              (&local_2d8,
               (vector<Rml::ColorStop,_std::allocator<Rml::ColorStop>_> *)
               &shader.super_UniqueRenderResource<Rml::CompiledShader,_unsigned_long,_0UL>.
                resource_handle);
    ::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
    ::pair<const_char_(&)[16],_Rml::Variant,_true>
              (&local_158,(char (*) [16])"color_stop_list",&local_2d8);
    mesh.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._7_1_ = 0;
    local_110 = &local_230;
    local_108 = 4;
    this_00 = (allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>
               *)((long)&mesh.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 5);
    ::std::
    allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>
    ::allocator(this_00);
    init._M_len = local_108;
    init._M_array = local_110;
    itlib::
    flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
    ::flat_map(&local_100,init,
               (key_compare *)
               ((long)&mesh.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 6),this_00);
    RenderManager::CompileShader((RenderManager *)local_b0,(String *)mesh_00,&local_d0);
    itlib::
    flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
    ::~flat_map(&local_100);
    ::std::
    allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>
    ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>
                  *)((long)&mesh.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 5));
    local_3b8 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
                 *)&local_110;
    do {
      local_3b8 = local_3b8 + -1;
      ::std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
      ::~pair(local_3b8);
    } while (local_3b8 != &local_230);
    Variant::~Variant(&local_2d8);
    Variant::~Variant(&local_2b0);
    Variant::~Variant(&local_288);
    Variant::~Variant(&local_260);
    ::std::__cxx11::string::~string((string *)&local_d0);
    ::std::allocator<char>::~allocator(&local_d1);
    bVar2 = UniqueRenderResource::operator_cast_to_bool((UniqueRenderResource *)local_b0);
    if (bVar2) {
      Mesh::Mesh((Mesh *)&computed);
      this_01 = Element::GetComputedValues(element);
      fVar3 = Style::ComputedValues::opacity(this_01);
      render_offset.y._3_1_ = (uchar)(int)(fVar3 * 255.0);
      Colour<unsigned_char,_255,_true>::Colour
                ((Colour<unsigned_char,_255,_true> *)((long)&render_offset.x + 3),
                 render_offset.y._3_1_,render_offset.y._3_1_);
      MeshUtilities::GenerateBackground
                ((Mesh *)&computed,(RenderBox *)&dimensions,
                 (ColourbPremultiplied)render_offset._3_4_);
      rhs = RenderBox::GetFillOffset((RenderBox *)&dimensions);
      __end1 = ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::begin
                         ((vector<Rml::Vertex,_std::allocator<Rml::Vertex>_> *)&computed);
      vertex = (Vertex *)
               ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::end
                         ((vector<Rml::Vertex,_std::allocator<Rml::Vertex>_> *)&computed);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<Rml::Vertex_*,_std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>_>
                                         *)&vertex), bVar2) {
        local_348 = __gnu_cxx::
                    __normal_iterator<Rml::Vertex_*,_std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>_>
                    ::operator*(&__end1);
        element_data = (ShaderElementData *)rhs;
        local_350 = Vector2<float>::operator-(&local_348->position,rhs);
        (local_348->tex_coord).x = local_350.x;
        (local_348->tex_coord).y = local_350.y;
        __gnu_cxx::
        __normal_iterator<Rml::Vertex_*,_std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>_>::
        operator++(&__end1);
      }
      this_02 = GetShaderElementDataPool();
      RenderManager::MakeGeometry((RenderManager *)local_370,(Mesh *)mesh_00);
      this_local = (DecoratorRadialGradient *)
                   Pool<Rml::ShaderElementData>::
                   AllocateAndConstruct<Rml::Geometry,Rml::CompiledShader>
                             (this_02,(Geometry *)local_370,(CompiledShader *)local_b0);
      Geometry::~Geometry((Geometry *)local_370);
      mesh.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ = 1;
      local_370._16_8_ = this_local;
      Mesh::~Mesh((Mesh *)&computed);
    }
    else {
      this_local = (DecoratorRadialGradient *)0x0;
      mesh.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ = 1;
    }
    CompiledShader::~CompiledShader((CompiledShader *)local_b0);
    ::std::vector<Rml::ColorStop,_std::allocator<Rml::ColorStop>_>::~vector
              ((vector<Rml::ColorStop,_std::allocator<Rml::ColorStop>_> *)
               &shader.super_UniqueRenderResource<Rml::CompiledShader,_unsigned_long,_0UL>.
                resource_handle);
  }
  return (DecoratorDataHandle)this_local;
}

Assistant:

DecoratorDataHandle DecoratorRadialGradient::GenerateElementData(Element* element, BoxArea paint_area) const
{
	RenderManager* render_manager = element->GetRenderManager();
	if (!render_manager)
		return INVALID_DECORATORDATAHANDLE;

	RMLUI_ASSERT(!color_stops.empty() && (shape == Shape::Circle || shape == Shape::Ellipse));

	const RenderBox render_box = element->GetRenderBox(paint_area);
	const Vector2f dimensions = render_box.GetFillSize();

	RadialGradientShape gradient_shape = CalculateRadialGradientShape(element, dimensions);

	// One-pixel minimum color stop spacing to avoid aliasing.
	const float soft_spacing = 1.f / Math::Min(gradient_shape.radius.x, gradient_shape.radius.y);

	ColorStopList resolved_stops = ResolveColorStops(element, gradient_shape.radius.x, soft_spacing, color_stops);

	CompiledShader shader = render_manager->CompileShader("radial-gradient",
		Dictionary{
			{"center", Variant(gradient_shape.center)},
			{"radius", Variant(gradient_shape.radius)},
			{"repeating", Variant(repeating)},
			{"color_stop_list", Variant(std::move(resolved_stops))},
		});
	if (!shader)
		return INVALID_DECORATORDATAHANDLE;

	Mesh mesh;
	const ComputedValues& computed = element->GetComputedValues();
	const byte alpha = byte(computed.opacity() * 255.f);
	MeshUtilities::GenerateBackground(mesh, render_box, ColourbPremultiplied(alpha, alpha));

	const Vector2f render_offset = render_box.GetFillOffset();
	for (Vertex& vertex : mesh.vertices)
		vertex.tex_coord = vertex.position - render_offset;

	ShaderElementData* element_data =
		GetShaderElementDataPool().AllocateAndConstruct(render_manager->MakeGeometry(std::move(mesh)), std::move(shader));
	return reinterpret_cast<DecoratorDataHandle>(element_data);
}